

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O0

tokens __thiscall JSON::JSONScanner::Scan(JSONScanner *this)

{
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  tokens tVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  char16_t *local_30;
  char16 *end;
  double val;
  char16 *saveCurrentChar;
  JSONScanner *this_local;
  
  this->pTokenString = this->currentChar;
  saveCurrentChar = (char16 *)this;
  do {
    if (this->inputText + this->inputLen <= this->currentChar) {
      this->pToken->tk = tkEOF;
      return tkEOF;
    }
    cVar3 = ReadNextChar(this);
    switch(cVar3) {
    case L'\0':
      this->currentChar = this->currentChar + -1;
      this->pToken->tk = tkEOF;
      return tkEOF;
    default:
      ThrowSyntaxError(this,-0x7ff5e9e9);
    case L'\t':
    case L'\n':
    case L'\r':
    case L' ':
      break;
    case L'\"':
      tVar4 = ScanString(this);
      return tVar4;
    case L',':
      this->pToken->tk = tkComma;
      return tkComma;
    case L'-':
      this->pToken->tk = tkSub;
      return tkSub;
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
      this->currentChar = this->currentChar + -1;
      val = (double)this->currentChar;
      bVar2 = IsJSONNumber(this);
      if (!bVar2) {
        ThrowSyntaxError(this,-0x7ff5e9ea);
      }
      this->currentChar = (char16 *)val;
      local_30 = (char16 *)0x0;
      end = (char16 *)
            Js::NumberUtilities::StrToDbl<char16_t>(this->currentChar,&local_30,this->scriptContext)
      ;
      if (this->currentChar != local_30) {
        BVar5 = Js::JavascriptNumber::IsNan((double)end);
        if (BVar5 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                             ,0x5f,"(!Js::JavascriptNumber::IsNan(val))",
                             "Bad result from string to double conversion");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        this->pToken->tk = tkFltCon;
        Token::SetDouble((Token *)this->pToken,(double)end,false);
        this->currentChar = local_30;
        return tkFltCon;
      }
      ThrowSyntaxError(this,-0x7ff5e9ea);
    case L':':
      this->pToken->tk = tkColon;
      return tkColon;
    case L'[':
      this->pToken->tk = tkLBrack;
      return tkLBrack;
    case L']':
      this->pToken->tk = tkRBrack;
      return tkRBrack;
    case L'f':
      if (((this->currentChar + 3 < this->inputText + this->inputLen) &&
          (*this->currentChar == L'a')) &&
         ((this->currentChar[1] == L'l' &&
          ((this->currentChar[2] == L's' && (this->currentChar[3] == L'e')))))) {
        this->currentChar = this->currentChar + 4;
        this->pToken->tk = tkFALSE;
        return tkFALSE;
      }
      ThrowSyntaxError(this,-0x7ff5e9e9);
    case L'n':
      if (((this->currentChar + 2 < this->inputText + this->inputLen) &&
          (*this->currentChar == L'u')) &&
         ((this->currentChar[1] == L'l' && (this->currentChar[2] == L'l')))) {
        this->currentChar = this->currentChar + 3;
        this->pToken->tk = tkNULL;
        return tkNULL;
      }
      ThrowSyntaxError(this,-0x7ff5e9e9);
    case L't':
      if ((((this->currentChar + 2 < this->inputText + this->inputLen) &&
           (*this->currentChar == L'r')) && (this->currentChar[1] == L'u')) &&
         (this->currentChar[2] == L'e')) {
        this->currentChar = this->currentChar + 3;
        this->pToken->tk = tkTRUE;
        return tkTRUE;
      }
      ThrowSyntaxError(this,-0x7ff5e9e9);
    case L'{':
      this->pToken->tk = tkLCurly;
      return tkLCurly;
    case L'}':
      this->pToken->tk = tkRCurly;
      return tkRCurly;
    }
  } while( true );
}

Assistant:

tokens JSONScanner::Scan()
    {
        pTokenString = currentChar;

        while (currentChar < inputText + inputLen)
        {
            switch(ReadNextChar())
            {
            case 0:
                //EOF
                currentChar--;
                return (pToken->tk = tkEOF);

            case '\t':
            case '\r':
            case '\n':
            case ' ':
                //WS - keep looping
                break;

            case '"':
                //check for string
                return ScanString();

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                //decimal digit starts a number
                {
                    currentChar--;

                    // we use StrToDbl() here for compat with the rest of the engine. StrToDbl() accept a larger syntax.
                    // Verify first the JSON grammar.
                    const char16* saveCurrentChar = currentChar;
                    if(!IsJSONNumber())
                    {
                       ThrowSyntaxError(JSERR_JsonBadNumber);
                    }
                    currentChar = saveCurrentChar;
                    double val;
                    const char16* end = nullptr;
                    val = Js::NumberUtilities::StrToDbl(currentChar, &end, scriptContext);
                    if(currentChar == end)
                    {
                       ThrowSyntaxError(JSERR_JsonBadNumber);
                    }
                    AssertMsg(!Js::JavascriptNumber::IsNan(val), "Bad result from string to double conversion");
                    pToken->tk = tkFltCon;
                    pToken->SetDouble(val, false);
                    currentChar = end;
                    return tkFltCon;
                }

            case ',':
                return (pToken->tk = tkComma);

            case ':':
                return (pToken->tk = tkColon);

            case '[':
                return (pToken->tk = tkLBrack);

            case ']':
                return (pToken->tk = tkRBrack);

            case '-':
                return (pToken->tk = tkSub);

            case 'n':
                //check for 'null'
                if (currentChar + 2 < inputText + inputLen  && currentChar[0] == 'u' && currentChar[1] == 'l' && currentChar[2] == 'l')
                {
                    currentChar += 3;
                    return (pToken->tk = tkNULL);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case 't':
                //check for 'true'
                if (currentChar + 2 < inputText + inputLen  && currentChar[0] == 'r' && currentChar[1] == 'u' && currentChar[2] == 'e')
                {
                    currentChar += 3;
                    return (pToken->tk = tkTRUE);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case 'f':
                //check for 'false'
                if (currentChar + 3 < inputText + inputLen  && currentChar[0] == 'a' && currentChar[1] == 'l' && currentChar[2] == 's' && currentChar[3] == 'e')
                {
                    currentChar += 4;
                    return (pToken->tk = tkFALSE);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case '{':
                return (pToken->tk = tkLCurly);

            case '}':
                return (pToken->tk = tkRCurly);

            default:
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }

        }

        return (pToken->tk = tkEOF);
    }